

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_csharp.cpp
# Opt level: O0

void __thiscall
flatbuffers::csharp::CSharpGenerator::GenStructVerifier
          (CSharpGenerator *this,StructDef *struct_def,string *code_ptr)

{
  string *code_ptr_local;
  StructDef *struct_def_local;
  CSharpGenerator *this_local;
  
  if ((((struct_def->super_Definition).generated & 1U) == 0) && ((struct_def->fixed & 1U) == 0)) {
    GenTableVerifier(this,struct_def,code_ptr);
  }
  return;
}

Assistant:

void GenStructVerifier(const StructDef &struct_def, std::string *code_ptr) {
    if (struct_def.generated) return;

    // cur_name_space_ = struct_def.defined_namespace;

    // Generate verifiers
    if (struct_def.fixed) {
      // Fixed size structures do not require table members
      // verification - instead structure size is verified using VerifyField
    } else {
      // Create table verification function
      GenTableVerifier(struct_def, code_ptr);
    }
  }